

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_segment_segment
          (REF_DBL *candidate0,REF_DBL *candidate1,REF_DBL *segment0,REF_DBL *segment1,REF_DBL *tt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_STATUS RVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  *tt = 0.0;
  tt[1] = 0.0;
  dVar1 = *segment0;
  dVar7 = segment0[1];
  dVar10 = *candidate0;
  dVar8 = candidate0[1];
  dVar2 = *segment1;
  dVar3 = segment1[1];
  dVar4 = *candidate1;
  dVar5 = candidate1[1];
  dVar9 = ((dVar5 - dVar8) * (dVar1 - dVar10) - (dVar4 - dVar10) * (dVar7 - dVar8)) * 0.5;
  dVar11 = ((dVar8 - dVar5) * (dVar2 - dVar4) - (dVar10 - dVar4) * (dVar3 - dVar5)) * 0.5 + dVar9;
  dVar12 = dVar11 * 1e+20;
  if (dVar12 <= -dVar12) {
    dVar12 = -dVar12;
  }
  dVar13 = dVar9;
  if (dVar9 <= -dVar9) {
    dVar13 = -dVar9;
  }
  RVar6 = 4;
  if (dVar13 < dVar12) {
    dVar10 = ((dVar3 - dVar7) * (dVar10 - dVar1) - (dVar2 - dVar1) * (dVar8 - dVar7)) * 0.5;
    *tt = dVar9 / dVar11;
    dVar1 = ((dVar7 - dVar3) * (dVar4 - dVar2) - (dVar5 - dVar3) * (dVar1 - dVar2)) * 0.5 + dVar10;
    dVar7 = dVar1 * 1e+20;
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    dVar8 = dVar10;
    if (dVar10 <= -dVar10) {
      dVar8 = -dVar10;
    }
    if (dVar8 < dVar7) {
      tt[1] = dVar10 / dVar1;
      RVar6 = 0;
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment_segment(REF_DBL *candidate0,
                                           REF_DBL *candidate1,
                                           REF_DBL *segment0, REF_DBL *segment1,
                                           REF_DBL *tt) {
  double cand0_area, cand1_area;
  double seg0_area, seg1_area;
  double total_area;

  tt[0] = 0.0;
  tt[1] = 0.0;

  /*         c1 tt[1]
   *        /
   *  s0---+----s1 tt[0]
   *      /
   *    c0
   */

  cand0_area = ref_iso_area(candidate0, segment1, segment0);
  cand1_area = ref_iso_area(candidate1, segment0, segment1);
  seg0_area = ref_iso_area(segment0, candidate1, candidate0);
  seg1_area = ref_iso_area(segment1, candidate0, candidate1);

  total_area = seg0_area + seg1_area;
  if (ref_math_divisible(seg0_area, total_area)) {
    tt[0] = seg0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  total_area = cand0_area + cand1_area;
  if (ref_math_divisible(cand0_area, total_area)) {
    tt[1] = cand0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}